

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

ssize_t zt_cstr_rany(char *s,ssize_t i,ssize_t j,char *set)

{
  size_t sVar1;
  ssize_t sVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDI;
  ssize_t t;
  size_t len;
  ssize_t orig;
  size_t in_stack_ffffffffffffffb8;
  ssize_t in_stack_ffffffffffffffc0;
  long local_20;
  long local_18;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    local_18 = IDX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar2 = IDX(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_20 = sVar2;
    if (sVar2 < local_18) {
      local_20 = local_18;
      local_18 = sVar2;
    }
  }
  while( true ) {
    if (local_20 < local_18) {
      return -1;
    }
    if ((in_RDI[local_20] != '\0') &&
       (pcVar3 = strchr(in_RCX,(int)in_RDI[local_20]), pcVar3 != (char *)0x0)) break;
    local_20 = local_20 + -1;
  }
  return local_20 - local_18;
}

Assistant:

ssize_t
zt_cstr_rany(const char *s, ssize_t i, ssize_t j, const char *set) {
    ssize_t   orig;

    zt_assert(s);
    zt_assert(set);

    CONVERT(s, i, j);

    zt_assert(i >= 0 && i <= j);

    for (orig = i; j >= i; j--) {
        if (s[j] != '\0' && strchr(set, s[j])) {
            return j - orig;
        }
    }

    return -1;
}